

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O1

Aig_Man_t *
Aig_ManScl(Aig_Man_t *pAig,int fLatchConst,int fLatchEqual,int fUseMvSweep,int nFramesSymb,
          int nFramesSatur,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  void **ppvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Man_t *pAVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  Aig_Obj_t *pAVar12;
  int iVar13;
  int iVar14;
  Aig_Obj_t **ppAVar15;
  
  if ((pAig->vClockDoms != (Vec_Vec_t *)0x0) && (0 < pAig->vClockDoms->nSize)) {
    pAVar5 = Aig_ManSclPart(pAig,fLatchConst,fLatchEqual,fVerbose);
    return pAVar5;
  }
  if (pAig->vFlopNums != (Vec_Int_t *)0x0) {
    __assert_fail("pAig->vFlopNums == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                  ,0x297,"Aig_Man_t *Aig_ManScl(Aig_Man_t *, int, int, int, int, int, int, int)");
  }
  pAVar5 = Aig_ManDupSimple(pAig);
  uVar11 = pAVar5->nRegs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar11 - 1) {
    uVar8 = uVar11;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar8;
  if (uVar8 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)(int)uVar8 << 2);
  }
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar11;
  if (0 < (int)uVar11) {
    uVar9 = 0;
    do {
      piVar7[uVar9] = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  pAVar5->vFlopNums = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  pAVar5->vFlopReprs = pVVar6;
  Aig_ManSeqCleanup(pAVar5);
  if ((fLatchConst != 0) && (pAVar5->nRegs != 0)) {
    pAVar5 = Aig_ManConstReduce(pAVar5,fUseMvSweep,nFramesSymb,nFramesSatur,fVerbose,fVeryVerbose);
  }
  if ((fLatchEqual != 0) && (pAVar5->nRegs != 0)) {
    pAVar5 = Aig_ManReduceLaches(pAVar5,fVerbose);
  }
  iVar13 = pAig->nObjs[2] - pAig->nRegs;
  Aig_ManReprStart(pAig,pAig->vObjs->nSize);
  pVVar6 = pAVar5->vFlopReprs;
  iVar14 = pVVar6->nSize;
  if (0 < iVar14) {
    lVar10 = 1;
    do {
      if (iVar14 <= lVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar11 = pVVar6->pArray[lVar10 + -1] + iVar13;
      if ((int)uVar11 < 0) {
LAB_006c8e89:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar14 = pAig->vCis->nSize;
      if (iVar14 <= (int)uVar11) goto LAB_006c8e89;
      iVar1 = pVVar6->pArray[lVar10];
      ppvVar2 = pAig->vCis->pArray;
      pAVar3 = (Aig_Obj_t *)ppvVar2[uVar11];
      ppAVar15 = &pAig->pConst1;
      if (iVar1 != -1) {
        uVar11 = iVar1 + iVar13;
        if (((int)uVar11 < 0) || (iVar14 <= (int)uVar11)) goto LAB_006c8e89;
        ppAVar15 = (Aig_Obj_t **)(ppvVar2 + uVar11);
      }
      pAVar4 = *ppAVar15;
      if (pAVar3 == pAVar4) {
        __assert_fail("pFlop1 != pFlop2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                      ,0x2aa,"Aig_Man_t *Aig_ManScl(Aig_Man_t *, int, int, int, int, int, int, int)"
                     );
      }
      pAVar12 = pAVar3;
      iVar14 = pAVar4->Id;
      if (pAVar4->Id < pAVar3->Id) {
        pAVar12 = pAVar4;
        iVar14 = pAVar3->Id;
      }
      pAig->pReprs[iVar14] = pAVar12;
      pVVar6 = pAVar5->vFlopReprs;
      iVar14 = pVVar6->nSize;
      iVar1 = (int)lVar10;
      lVar10 = lVar10 + 2;
    } while (iVar1 + 1 < iVar14);
  }
  Aig_ManStop(pAVar5);
  pAVar5 = Aig_ManDupRepr(pAig,0);
  Aig_ManSeqCleanup(pAVar5);
  return pAVar5;
}

Assistant:

Aig_Man_t * Aig_ManScl( Aig_Man_t * pAig, int fLatchConst, int fLatchEqual, int fUseMvSweep, int nFramesSymb, int nFramesSatur, int fVerbose, int fVeryVerbose )
{
    extern void Saig_ManReportUselessRegisters( Aig_Man_t * pAig );
    extern int Saig_ManReportComplements( Aig_Man_t * p );

    Aig_Man_t * pAigInit, * pAigNew;
    Aig_Obj_t * pFlop1, * pFlop2;
    int i, Entry1, Entry2, nTruePis;//, nRegs;

    if ( pAig->vClockDoms && Vec_VecSize(pAig->vClockDoms) > 0 )
        return Aig_ManSclPart( pAig, fLatchConst, fLatchEqual, fVerbose);

    // store the original AIG
    assert( pAig->vFlopNums == NULL );
    pAigInit = pAig;
    pAig = Aig_ManDupSimple( pAig );
    // create storage for latch numbers
    pAig->vFlopNums = Vec_IntStartNatural( pAig->nRegs );
    pAig->vFlopReprs = Vec_IntAlloc( 100 );
    Aig_ManSeqCleanup( pAig );
    if ( fLatchConst && pAig->nRegs )
        pAig = Aig_ManConstReduce( pAig, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
    if ( fLatchEqual && pAig->nRegs )
        pAig = Aig_ManReduceLaches( pAig, fVerbose );
    // translate pairs into reprs
    nTruePis = Aig_ManCiNum(pAigInit)-Aig_ManRegNum(pAigInit);
    Aig_ManReprStart( pAigInit, Aig_ManObjNumMax(pAigInit) );
    Vec_IntForEachEntry( pAig->vFlopReprs, Entry1, i )
    {
        Entry2 = Vec_IntEntry( pAig->vFlopReprs, ++i ); 
        pFlop1 = Aig_ManCi( pAigInit, nTruePis + Entry1 );
        pFlop2 = (Entry2 == -1)? Aig_ManConst1(pAigInit) : Aig_ManCi( pAigInit, nTruePis + Entry2 );
        assert( pFlop1 != pFlop2 );
        if ( pFlop1->Id > pFlop2->Id )
            pAigInit->pReprs[pFlop1->Id] = pFlop2;
        else
            pAigInit->pReprs[pFlop2->Id] = pFlop1;
    }
    Aig_ManStop( pAig );
//    Aig_ManSeqCleanup( pAigInit );
    pAigNew = Aig_ManDupRepr( pAigInit, 0 );
    Aig_ManSeqCleanup( pAigNew );

//    Saig_ManReportUselessRegisters( pAigNew );
    if ( Aig_ManRegNum(pAigNew) == 0 )
        return pAigNew;
//    nRegs = Saig_ManReportComplements( pAigNew );
//    if ( nRegs ) 
//    printf( "The number of complemented registers = %d.\n", nRegs );
    return pAigNew;
}